

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TapeUEF.cpp
# Opt level: O0

void __thiscall Storage::Tape::UEF::queue_defined_data(UEF *this,uint32_t length)

{
  byte bVar1;
  uint8_t uVar2;
  byte bVar3;
  uint uVar4;
  int iVar5;
  Time duration;
  int stop_bits;
  int c;
  uint8_t parity_value;
  uint8_t byte;
  bool has_extra_stop_wave;
  int number_of_stop_bits;
  int iStack_14;
  char parity_type;
  int bits_per_packet;
  uint32_t length_local;
  UEF *this_local;
  
  if (2 < length) {
    bVar1 = gzget8(this->file_);
    uVar2 = gzget8(this->file_);
    bVar3 = gzget8(this->file_);
    uVar4 = (uint)bVar3;
    if (uVar4 == 0) {
      uVar4 = -uVar4;
    }
    iStack_14 = length - 3;
    while (iVar5 = iStack_14 + -1, iStack_14 != 0) {
      stop_bits._2_1_ = gzget8(this->file_);
      bVar3 = stop_bits._2_1_ ^ (byte)((int)(uint)stop_bits._2_1_ >> 4);
      bVar3 = bVar3 ^ (byte)((int)(uint)bVar3 >> 2);
      bVar3 = bVar3 ^ (byte)((int)(uint)bVar3 >> 1);
      queue_bit(this,0);
      duration.clock_rate = (uint)bVar1;
      while (duration.clock_rate != 0) {
        queue_bit(this,stop_bits._2_1_ & 1);
        stop_bits._2_1_ = (byte)((int)(uint)stop_bits._2_1_ >> 1);
        duration.clock_rate = duration.clock_rate - 1;
      }
      duration.length = uVar4;
      if (uVar2 == 'E') {
        queue_bit(this,bVar3 & 1);
      }
      else if (uVar2 == 'O') {
        queue_bit(this,bVar3 & 1 ^ 1);
      }
      while (iStack_14 = iVar5, duration.length != 0) {
        queue_bit(this,1);
        duration.length = duration.length - 1;
      }
    }
  }
  return;
}

Assistant:

void UEF::queue_defined_data(uint32_t length) {
	if(length < 3) return;

	const int bits_per_packet = gzget8(file_);
	const char parity_type = char(gzget8(file_));
	int number_of_stop_bits = gzget8(file_);

	const bool has_extra_stop_wave = (number_of_stop_bits < 0);
	number_of_stop_bits = abs(number_of_stop_bits);

	length -= 3;
	while(length--) {
		uint8_t byte = gzget8(file_);

		uint8_t parity_value = byte;
		parity_value ^= (parity_value >> 4);
		parity_value ^= (parity_value >> 2);
		parity_value ^= (parity_value >> 1);

		queue_bit(0);
		int c = bits_per_packet;
		while(c--) {
			queue_bit(byte&1);
			byte >>= 1;
		}

		switch(parity_type) {
			default: break;
			case 'E': queue_bit(parity_value&1);		break;
			case 'O': queue_bit((parity_value&1) ^ 1);	break;
		}

		int stop_bits = number_of_stop_bits;
		while(stop_bits--) queue_bit(1);
		if(has_extra_stop_wave) {
			Time duration;
			duration.length = 1;
			duration.clock_rate = time_base_ * 4;
			emplace_back(Pulse::Low, duration);
			emplace_back(Pulse::High, duration);
		}
	}
}